

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::BeginPhase(Func *this,Phase tag)

{
  int iVar1;
  Func *pFVar2;
  ScriptContextProfiler *pSVar3;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar6;
  
  pFVar2 = this->topFunc;
  JsUtil::List<Js::Phase,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(&(pFVar2->currentPhases).list,0);
  iVar1 = (pFVar2->currentPhases).list.
          super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.count;
  (pFVar2->currentPhases).list.
  super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.buffer[iVar1] = tag;
  (pFVar2->currentPhases).list.
  super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.count = iVar1 + 1;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015aa448,tag,sourceContextId,functionId);
  if (bVar5) {
    pcVar4 = (code *)swi(3);
    (*pcVar4)();
    return;
  }
  pSVar3 = this->m_codeGenProfiler;
  bVar5 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar5 == (pSVar3 == (ScriptContextProfiler *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4ef,
                       "((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                       ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  if (this->m_codeGenProfiler != (ScriptContextProfiler *)0x0) {
    Js::ScriptContextProfiler::ProfileBegin(this->m_codeGenProfiler,tag);
    return;
  }
  return;
}

Assistant:

void
Func::BeginPhase(Js::Phase tag)
{
#ifdef DBG
    this->GetTopFunc()->currentPhases.Push(tag);

    if (PHASE_DEBUGBREAK_ON_PHASE_BEGIN(tag, this))
    {
        __debugbreak();
    }
#endif

#ifdef PROFILE_EXEC
    AssertMsg((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
        "Profiler tag is supplied but the profiler pointer is NULL");
    if (this->m_codeGenProfiler)
    {
        this->m_codeGenProfiler->ProfileBegin(tag);
    }
#endif
}